

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall gmlc::networking::TcpServer::initialConnect(TcpServer *this)

{
  pointer pbVar1;
  pointer psVar2;
  element_type *this_00;
  ulong __val;
  int iVar3;
  undefined4 extraout_var;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  int __val_00;
  shared_ptr<gmlc::networking::TcpAcceptor> *in_RSI;
  string *this_01;
  pointer psVar4;
  pointer ep;
  allocator<char> local_169;
  pointer acc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  ulong local_120;
  ulong local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [24];
  code *local_58;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  if (((this->halted)._M_base._M_i & 1U) == 0) {
    pbVar1 = (this->endpoints).
             super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ep = (this->endpoints).
              super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
              ._M_impl.super__Vector_impl_data._M_start; ep != pbVar1; ep = ep + 1) {
      TcpAcceptor::create((TcpAcceptor *)&acc,this->ioctx,ep);
      if (this->reuse_address == true) {
        local_140._M_dataplus._M_p._0_4_ = 1;
        asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
        set_option<asio::detail::socket_option::boolean<1,2>>
                  ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                   &(acc.
                     super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->acceptor_,(boolean<1,_2> *)&local_140);
      }
      else {
        local_140._M_dataplus._M_p._0_4_ = 0;
        asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
        set_option<asio::detail::socket_option::boolean<1,2>>
                  ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                   &(acc.
                     super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->acceptor_,(boolean<1,_2> *)&local_140);
      }
      local_70._8_8_ = 0;
      local_58 = std::
                 _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
                 ::_M_invoke;
      local_70._16_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
           ::_M_manager;
      local_70._0_8_ = this;
      std::
      function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
      ::operator=(&(acc.
                    super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->acceptCall,
                  (function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                   *)local_70);
      std::_Function_base::~_Function_base((_Function_base *)local_70);
      this_00 = acc.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_50,&this->logFunction);
        TcpAcceptor::setLoggingFunction(this_00,&local_50);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
      }
      in_RSI = &acc;
      std::
      vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
      ::emplace_back<std::shared_ptr<gmlc::networking::TcpAcceptor>>
                ((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
                  *)&this->acceptors,in_RSI);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&acc.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      in_RDX = extraout_RDX;
    }
    psVar4 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __val_00 = 1;
    local_118 = 0;
    local_120 = 0;
    for (; __val = local_120, psVar4 != psVar2; psVar4 = psVar4 + 1) {
      iVar3 = TcpAcceptor::connect
                        ((psVar4->
                         super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,(int)in_RSI,in_RDX,in_ECX);
      if ((char)iVar3 == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"unable to connect acceptor ",(allocator<char> *)&local_90);
        std::__cxx11::to_string(&local_f0,__val_00);
        std::operator+(&local_d0,&local_110,&local_f0);
        std::operator+(&local_140,&local_d0," of ");
        std::__cxx11::to_string
                  (&local_b0,
                   (long)(this->acceptors).
                         super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->acceptors).
                         super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&acc,
                       &local_140,&local_b0);
        in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)0x0;
        logger(this,0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&acc);
        std::__cxx11::string::~string((string *)&acc);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        in_RDX = extraout_RDX_01;
      }
      else {
        local_120 = local_120 + 1;
        local_118 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        in_RDX = extraout_RDX_00;
      }
      __val_00 = __val_00 + 1;
    }
    if ((local_118 & 1) != 0) {
      if ((ulong)((long)(this->acceptors).
                        super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->acceptors).
                        super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= local_120) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"partial connection on the server ",&local_169);
      std::__cxx11::to_string(&local_b0,__val);
      std::operator+(&local_110,&local_f0,&local_b0);
      std::operator+(&local_d0,&local_110," of ");
      std::__cxx11::to_string
                (&local_90,
                 (long)(this->acceptors).
                       super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->acceptors).
                       super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::operator+(&local_140,&local_d0,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&acc,
                     &local_140," were connected");
      logger(this,1,(string *)&acc);
      std::__cxx11::string::~string((string *)&acc);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      this_01 = &local_f0;
      goto LAB_00374e01;
    }
    LOCK();
    (this->halted)._M_base._M_i = true;
    UNLOCK();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&acc,"halting server operation",(allocator<char> *)&local_140);
    logger(this,1,(string *)&acc);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&acc,"previously halted server",(allocator<char> *)&local_140);
    logger(this,0,(string *)&acc);
  }
  this_01 = (string *)&acc;
LAB_00374e01:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void TcpServer::initialConnect()
{
    if (halted.load(std::memory_order_acquire)) {
        logger(0, "previously halted server");
        return;
    }
    for (auto& ep : endpoints) {
        auto acc = TcpAcceptor::create(ioctx, ep);
        if (reuse_address) {
            acc->set_option(tcp::acceptor::reuse_address(true));
        } else {
            acc->set_option(tcp::acceptor::reuse_address(false));
        }
        acc->setAcceptCall(
            [this](TcpAcceptor::pointer accPtr, TcpConnection::pointer conn) {
                handle_accept(std::move(accPtr), std::move(conn));
            });
        if (logFunction) {
            acc->setLoggingFunction(logFunction);
        }
        acceptors.push_back(std::move(acc));
    }
    bool anyConnect = false;
    size_t connectedAcceptors = 0;
    int index = 0;
    for (auto& acc : acceptors) {
        ++index;
        if (!acc->connect()) {
            logger(
                0,
                std::string("unable to connect acceptor ") +
                    std::to_string(index) + " of " +
                    std::to_string(acceptors.size()));
            continue;
        }
        ++connectedAcceptors;
        anyConnect = true;
    }
    if (!anyConnect) {
        halted = true;
        logger(1, "halting server operation");
        return;
    }
    if (connectedAcceptors < acceptors.size()) {
        logger(
            1,
            std::string("partial connection on the server ") +
                std::to_string(connectedAcceptors) + " of " +
                std::to_string(acceptors.size()) + " were connected");
    }
}